

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Block::ReadFile(Block *this)

{
  ostream *poVar1;
  ifstream in;
  long local_218 [4];
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(local_218);
  std::ifstream::open((string *)local_218,(_Ios_Openmode)this);
  if ((abStack_1f8[*(long *)(local_218[0] + -0x18)] & 1) == 0) {
    std::istream::seekg(local_218,(long)this->FileOff << 0xd,0);
    std::istream::read((char *)local_218,(long)this->data);
    std::ifstream::close();
    std::ifstream::~ifstream(local_218);
    return;
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->FileName)._M_dataplus._M_p,
                      (this->FileName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": No such a file!",0x11);
  std::endl<char,std::char_traits<char>>(poVar1);
  system("pause");
  exit(1);
}

Assistant:

void Block::ReadFile(void) {
	ifstream in;
	in.open(this->FileName, ios::in | ios::binary);
	if (in.bad()) {
		cout << this->FileName << ": No such a file!" << endl;
		system("pause");
		exit(1);
	}
	in.seekg(this->FileOff * BLOCK_SIZE);
	//cout << in.tellg() << endl;
	in.read(reinterpret_cast<char*> (this->data), BLOCK_SIZE);
	in.close();
}